

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O0

void nested_markable::test_opt_opt_bool(void)

{
  bool bVar1;
  reference_type rVar2;
  representation_type *prVar3;
  representation_type *prVar4;
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> local_f;
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> local_e;
  value_type local_d;
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> local_c;
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> local_b;
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> local_a;
  markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none> local_9 [7];
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> ob;
  optopt_bool oob;
  
  ak_toolkit::markable_ns::
  markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::markable
            (local_9);
  bVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::
          has_value(local_9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oob.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x452,"void nested_markable::test_opt_opt_bool()");
  }
  prVar3 = ak_toolkit::markable_ns::
           markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::
           representation_value(local_9);
  if (*prVar3 != '\x04') {
    __assert_fail("char(4) == oob.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x453,"void nested_markable::test_opt_opt_bool()");
  }
  ak_toolkit::markable_ns::
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::markable
            (&local_a);
  prVar4 = ak_toolkit::markable_ns::
           markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::
           representation_value(&local_a);
  if (*prVar4 != '\x02') {
    __assert_fail("char(2) == ob.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x456,"void nested_markable::test_opt_opt_bool()");
  }
  bVar1 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_a);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ob.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x457,"void nested_markable::test_opt_opt_bool()");
  }
  ak_toolkit::markable_ns::
  markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::assign
            (local_9,&local_a);
  bVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::
          has_value(local_9);
  if (!bVar1) {
    __assert_fail("oob.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x45a,"void nested_markable::test_opt_opt_bool()");
  }
  local_b._storage =
       (storage_type_conflict)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::value
                 (local_9);
  bVar1 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_b);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oob.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x45b,"void nested_markable::test_opt_opt_bool()");
  }
  prVar3 = ak_toolkit::markable_ns::
           markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::
           representation_value(local_9);
  if (*prVar3 != '\x02') {
    __assert_fail("char(2) == oob.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x45c,"void nested_markable::test_opt_opt_bool()");
  }
  local_d = true;
  ak_toolkit::markable_ns::
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::markable
            (&local_c,&local_d);
  ak_toolkit::markable_ns::
  markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::assign
            (local_9,&local_c);
  bVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::
          has_value(local_9);
  if (!bVar1) {
    __assert_fail("oob.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x45f,"void nested_markable::test_opt_opt_bool()");
  }
  local_e._storage =
       (storage_type_conflict)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::value
                 (local_9);
  bVar1 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::
          has_value(&local_e);
  if (!bVar1) {
    __assert_fail("oob.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x460,"void nested_markable::test_opt_opt_bool()");
  }
  local_f._storage =
       (storage_type_conflict)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::value
                 (local_9);
  rVar2 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::value
                    (&local_f);
  if (rVar2) {
    prVar3 = ak_toolkit::markable_ns::
             markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::
             representation_value(local_9);
    if (*prVar3 == '\x01') {
      return;
    }
    __assert_fail("char(1) == oob.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x462,"void nested_markable::test_opt_opt_bool()");
  }
  __assert_fail("oob.value().value() == true",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x461,"void nested_markable::test_opt_opt_bool()");
}

Assistant:

void test_opt_opt_bool()
  {
    static_assert(sizeof(optopt_bool) == sizeof(char), "excessive size");
    optopt_bool oob {};
    assert(!oob.has_value());
    assert(char(4) == oob.representation_value());

    markable<mark_bool> ob {};
    assert(char(2) == ob.representation_value());
    assert(!ob.has_value());

    oob.assign(ob);
    assert(oob.has_value());
    assert(!oob.value().has_value());
    assert(char(2) == oob.representation_value());

    oob.assign(markable<mark_bool>{true});
    assert(oob.has_value());
    assert(oob.value().has_value());
    assert(oob.value().value() == true);
    assert(char(1) == oob.representation_value());
  }